

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O0

void __thiscall String::~String(String *this)

{
  String *this_local;
  
  ~String(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

String() = default;